

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::im2col_sgemm_pack8to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int *piVar12;
  uint uVar13;
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  long lVar19;
  ulong uVar20;
  undefined8 *puVar21;
  long lVar22;
  undefined1 (*pauVar23) [32];
  long lVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  undefined8 *puVar27;
  int iVar28;
  undefined1 (*pauVar29) [32];
  long lVar30;
  int iVar31;
  ulong uVar32;
  int nn;
  int iVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 local_88 [64];
  size_t local_48;
  ulong local_38;
  
  uVar2 = bottom_im2col->w;
  uVar32 = (ulong)(int)uVar2;
  iVar33 = bottom_im2col->h;
  uVar17 = bottom_im2col->c;
  uVar15 = (ulong)uVar17;
  local_38 = (ulong)(uint)top_blob->c;
  local_48 = 0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_8_ = 0;
  local_88._24_4_ = 0;
  local_88._32_8_ = (Allocator *)0x0;
  local_88._40_4_ = 0;
  local_88._44_4_ = 0;
  local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
  if ((long)uVar32 < 4) {
    uVar13 = uVar2;
    iVar31 = iVar33;
    if (1 < (int)uVar2) {
      iVar31 = iVar33 * 2;
      uVar13 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar13 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    iVar31 = iVar33 * 4;
  }
  Mat::create((Mat *)local_88,iVar31,uVar17,uVar13,8,8,opt->workspace_allocator);
  uVar13 = (int)uVar2 >> 2;
  if (0 < (int)uVar13) {
    lVar19 = 0;
    uVar20 = 0;
    do {
      if (0 < (int)uVar17) {
        pauVar23 = (undefined1 (*) [32])(local_48 * uVar20 * local_88._16_8_ + local_88._0_8_);
        uVar25 = 0;
        do {
          if (0 < iVar33) {
            pauVar29 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + lVar19);
            iVar31 = iVar33;
            do {
              *pauVar23 = *pauVar29;
              pauVar23 = pauVar23 + 1;
              pauVar29 = (undefined1 (*) [32])(*pauVar29 + (ulong)uVar2 * 8);
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar15);
      }
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x20;
    } while (uVar20 != uVar13);
  }
  uVar16 = uVar2 >> 1 & 1;
  if ((uVar16 != 0) && (0 < (int)uVar17)) {
    pauVar14 = (undefined1 (*) [16])
               ((long)(int)uVar13 * local_48 * local_88._16_8_ + local_88._0_8_);
    uVar20 = 0;
    do {
      if (0 < iVar33) {
        pauVar26 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 +
                   (uVar32 & 0xfffffffffffffffc) * 8);
        iVar31 = iVar33;
        do {
          *pauVar14 = *pauVar26;
          pauVar14 = pauVar14 + 1;
          pauVar26 = (undefined1 (*) [16])(*pauVar26 + uVar32 * 8);
          iVar31 = iVar31 + -1;
        } while (iVar31 != 0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar15);
  }
  iVar31 = (int)(uVar32 & 0xfffffffffffffffc) + uVar16 * 2;
  if (iVar31 < (int)uVar2) {
    uVar20 = (ulong)iVar31;
    pvVar18 = (void *)(uVar20 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar17) {
        iVar28 = (int)uVar20;
        iVar31 = iVar28 + 3;
        if (-1 < iVar28) {
          iVar31 = iVar28;
        }
        puVar21 = (undefined8 *)
                  ((long)(int)((int)((char)((char)uVar20 - ((byte)iVar31 & 0xfc)) / '\x02') +
                              (iVar31 >> 2) +
                              (iVar28 - (((uint)(uVar20 >> 0x1f) & 1) + iVar28 & 0xfffffffe))) *
                   local_48 * local_88._16_8_ + local_88._0_8_);
        uVar25 = 0;
        do {
          if (0 < iVar33) {
            puVar27 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + (long)pvVar18);
            iVar31 = iVar33;
            do {
              *puVar21 = *puVar27;
              puVar21 = puVar21 + 1;
              puVar27 = puVar27 + uVar32;
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar15);
      }
      uVar20 = uVar20 + 1;
      pvVar18 = (void *)((long)pvVar18 + 8);
    } while (uVar20 != uVar32);
  }
  if (0 < (int)local_38) {
    iVar33 = uVar17 * iVar33;
    uVar15 = 0;
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x603000007020000));
    auVar51 = ZEXT3264(auVar7);
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x60300000702));
    auVar36 = ZEXT3264(auVar7);
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
    auVar37 = ZEXT3264(auVar7);
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x40100000500));
    do {
      pauVar23 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar15 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar2 < 4) {
        uVar20 = 0;
      }
      else {
        lVar19 = 0;
        uVar25 = 0;
        do {
          auVar35 = auVar36._0_32_;
          auVar50 = auVar51._0_32_;
          if (iVar33 < 1) {
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar46 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar48 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar34 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            lVar22 = local_48 * local_88._16_8_ * lVar19;
            lVar24 = kernel->cstep * uVar15 * kernel->elemsize;
            auVar43 = ZEXT1664((undefined1  [16])0x0);
            lVar30 = 0;
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            auVar51 = ZEXT1664((undefined1  [16])0x0);
            auVar37 = ZEXT1664((undefined1  [16])0x0);
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            iVar31 = iVar33;
            do {
              auVar46 = vpmovsxbw_avx2(*(undefined1 (*) [16])(local_88._0_8_ + lVar30 + lVar22));
              auVar40 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar30 + lVar24))
              ;
              auVar38 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar30 + lVar24 + 0x10));
              auVar34 = vpmaddwd_avx2(auVar46,auVar40);
              auVar34 = vpaddd_avx2(auVar34,auVar43._0_32_);
              auVar43 = ZEXT3264(auVar34);
              auVar44 = vpermq_avx2(auVar46,0x4e);
              auVar48 = vpmaddwd_avx2(auVar44,auVar40);
              auVar48 = vpaddd_avx2(auVar49._0_32_,auVar48);
              auVar49 = ZEXT3264(auVar48);
              auVar46 = vpmaddwd_avx2(auVar46,auVar38);
              auVar46 = vpaddd_avx2(auVar47._0_32_,auVar46);
              auVar47 = ZEXT3264(auVar46);
              auVar44 = vpmaddwd_avx2(auVar44,auVar38);
              auVar39 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        (local_88._0_8_ + lVar30 + lVar22 + 0x10));
              auVar44 = vpaddd_avx2(auVar45._0_32_,auVar44);
              auVar45 = ZEXT3264(auVar44);
              auVar41 = vpmaddwd_avx2(auVar39,auVar40);
              auVar41 = vpaddd_avx2(auVar41,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar41);
              auVar11 = vpermq_avx2(auVar39,0x4e);
              auVar40 = vpmaddwd_avx2(auVar40,auVar11);
              auVar40 = vpaddd_avx2(auVar40,auVar51._0_32_);
              auVar51 = ZEXT3264(auVar40);
              auVar39 = vpmaddwd_avx2(auVar39,auVar38);
              auVar39 = vpaddd_avx2(auVar39,auVar37._0_32_);
              auVar37 = ZEXT3264(auVar39);
              auVar38 = vpmaddwd_avx2(auVar38,auVar11);
              auVar38 = vpaddd_avx2(auVar38,auVar36._0_32_);
              auVar36 = ZEXT3264(auVar38);
              lVar30 = lVar30 + 0x20;
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
          }
          auVar11 = vpunpckldq_avx2(auVar34,auVar48);
          auVar8 = vpunpckldq_avx2(auVar46,auVar44);
          auVar48 = vpunpckhdq_avx2(auVar34,auVar48);
          auVar44 = vpunpckhdq_avx2(auVar46,auVar44);
          auVar9 = vpunpckldq_avx2(auVar41,auVar40);
          auVar10 = vpunpckldq_avx2(auVar39,auVar38);
          auVar41 = vpunpckhdq_avx2(auVar41,auVar40);
          auVar40 = vpunpckhdq_avx2(auVar39,auVar38);
          auVar51 = ZEXT3264(auVar50);
          auVar34 = vpermd_avx2(auVar50,auVar8);
          auVar36 = ZEXT3264(auVar35);
          auVar46 = vpermd_avx2(auVar35,auVar11);
          auVar34 = vpblendd_avx2(auVar46,auVar34,0xcc);
          auVar46 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
          auVar37 = ZEXT3264(auVar46);
          auVar39 = vpermd_avx2(auVar46,auVar8);
          auVar38 = vpermd_avx2(auVar7,auVar11);
          auVar39 = vpblendd_avx2(auVar38,auVar39,0xcc);
          auVar34 = vpaddd_avx2(auVar39,auVar34);
          auVar39 = vpermd_avx2(auVar50,auVar44);
          auVar38 = vpermd_avx2(auVar35,auVar48);
          auVar39 = vpblendd_avx2(auVar38,auVar39,0xcc);
          auVar44 = vpermd_avx2(auVar46,auVar44);
          auVar48 = vpermd_avx2(auVar7,auVar48);
          auVar48 = vpblendd_avx2(auVar48,auVar44,0xcc);
          auVar48 = vpaddd_avx2(auVar39,auVar48);
          auVar34 = vpaddd_avx2(auVar34,auVar48);
          auVar48 = vpermd_avx2(auVar50,auVar10);
          auVar44 = vpermd_avx2(auVar35,auVar9);
          auVar48 = vpblendd_avx2(auVar44,auVar48,0xcc);
          auVar44 = vpermd_avx2(auVar46,auVar10);
          auVar39 = vpermd_avx2(auVar7,auVar9);
          auVar44 = vpblendd_avx2(auVar39,auVar44,0xcc);
          auVar48 = vpaddd_avx2(auVar44,auVar48);
          auVar50 = vpermd_avx2(auVar50,auVar40);
          auVar35 = vpermd_avx2(auVar35,auVar41);
          auVar35 = vpblendd_avx2(auVar35,auVar50,0xcc);
          auVar50 = vpermd_avx2(auVar46,auVar40);
          auVar46 = vpermd_avx2(auVar7,auVar41);
          auVar50 = vpblendd_avx2(auVar46,auVar50,0xcc);
          auVar35 = vpaddd_avx2(auVar35,auVar50);
          auVar35 = vpaddd_avx2(auVar48,auVar35);
          *pauVar23 = auVar34;
          pauVar23[1] = auVar35;
          pauVar23 = pauVar23 + 2;
          uVar20 = uVar25 + 4;
          lVar22 = uVar25 + 7;
          lVar19 = lVar19 + 1;
          uVar25 = uVar20;
        } while (lVar22 < (long)uVar32);
      }
      if ((int)((uint)uVar20 | 1) < (int)uVar2) {
        uVar17 = 0;
        do {
          iVar31 = (int)uVar20;
          if (iVar33 < 1) {
            auVar35 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar50 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar34 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar48 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            lVar19 = kernel->cstep * uVar15 * kernel->elemsize;
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            lVar22 = 0;
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar43 = ZEXT1664((undefined1  [16])0x0);
            iVar28 = iVar33;
            do {
              auVar34 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        (local_88._0_8_ +
                                        lVar22 + local_48 * local_88._16_8_ *
                                                 (ulong)((uVar17 & 1) +
                                                        ((uint)(uVar20 >> 2) & 0x3fffffff))));
              auVar50 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar22 * 2 + lVar19));
              auVar48 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar22 * 2 + lVar19 + 0x10));
              auVar35 = vpmaddwd_avx2(auVar50,auVar34);
              auVar35 = vpaddd_avx2(auVar35,auVar43._0_32_);
              auVar43 = ZEXT3264(auVar35);
              auVar46 = vpermq_avx2(auVar34,0x4e);
              auVar50 = vpmaddwd_avx2(auVar46,auVar50);
              auVar50 = vpaddd_avx2(auVar50,auVar47._0_32_);
              auVar47 = ZEXT3264(auVar50);
              auVar34 = vpmaddwd_avx2(auVar48,auVar34);
              auVar34 = vpaddd_avx2(auVar34,auVar45._0_32_);
              auVar45 = ZEXT3264(auVar34);
              auVar48 = vpmaddwd_avx2(auVar46,auVar48);
              auVar48 = vpaddd_avx2(auVar48,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar48);
              lVar22 = lVar22 + 0x10;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          auVar46 = vpunpckldq_avx2(auVar35,auVar50);
          auVar44 = vpunpckldq_avx2(auVar34,auVar48);
          auVar50 = vpunpckhdq_avx2(auVar35,auVar50);
          auVar34 = vpunpckhdq_avx2(auVar34,auVar48);
          auVar35 = vpermd_avx2(auVar51._0_32_,auVar44);
          auVar48 = vpermd_avx2(auVar36._0_32_,auVar46);
          auVar35 = vpblendd_avx2(auVar48,auVar35,0xcc);
          auVar48 = vpermd_avx2(auVar37._0_32_,auVar44);
          auVar46 = vpermd_avx2(auVar7,auVar46);
          auVar48 = vpblendd_avx2(auVar46,auVar48,0xcc);
          auVar35 = vpaddd_avx2(auVar48,auVar35);
          auVar48 = vpermd_avx2(auVar51._0_32_,auVar34);
          auVar46 = vpermd_avx2(auVar36._0_32_,auVar50);
          auVar48 = vpblendd_avx2(auVar46,auVar48,0xcc);
          auVar34 = vpermd_avx2(auVar37._0_32_,auVar34);
          auVar50 = vpermd_avx2(auVar7,auVar50);
          auVar50 = vpblendd_avx2(auVar50,auVar34,0xcc);
          auVar50 = vpaddd_avx2(auVar48,auVar50);
          auVar35 = vpaddd_avx2(auVar35,auVar50);
          *pauVar23 = auVar35;
          pauVar23 = pauVar23 + 1;
          uVar13 = iVar31 + 2;
          uVar25 = (ulong)uVar13;
          uVar17 = (uint)(byte)((char)uVar17 + 1);
          uVar20 = (ulong)uVar13;
        } while (iVar31 + 3 < (int)uVar2);
      }
      else {
        uVar25 = uVar20 & 0xffffffff;
      }
      if ((int)uVar25 < (int)uVar2) {
        do {
          uVar17 = (uint)uVar25;
          if (iVar33 < 1) {
            auVar35 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar50 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar14 = (undefined1 (*) [16])
                       (kernel->cstep * uVar15 * kernel->elemsize + (long)kernel->data);
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            lVar19 = 0;
            auVar43 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)(local_88._0_8_ +
                                       lVar19 * 8 +
                                       local_48 * local_88._16_8_ *
                                       (ulong)((uVar17 & 1) + (int)(uVar25 >> 2) +
                                              (uint)((uVar17 >> 1 & 1) != 0)));
              auVar1 = vpmovsxbw_avx(auVar1);
              auVar35 = vpmovsxbw_avx2(*pauVar14);
              auVar50 = vpmovsxbw_avx2(pauVar14[1]);
              auVar34._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar1;
              auVar34._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
              auVar35 = vpmaddwd_avx2(auVar34,auVar35);
              auVar35 = vpaddd_avx2(auVar35,auVar43._0_32_);
              auVar43 = ZEXT3264(auVar35);
              auVar50 = vpmaddwd_avx2(auVar34,auVar50);
              auVar50 = vpaddd_avx2(auVar50,auVar42._0_32_);
              auVar42 = ZEXT3264(auVar50);
              pauVar14 = pauVar14 + 2;
              lVar19 = lVar19 + 1;
            } while (iVar33 != (int)lVar19);
          }
          auVar1 = vpunpckldq_avx(auVar35._0_16_,auVar35._16_16_);
          auVar5 = vpunpckldq_avx(auVar50._0_16_,auVar50._16_16_);
          auVar3 = vpunpckhdq_avx(auVar35._0_16_,auVar35._16_16_);
          auVar4 = vpunpckhdq_avx(auVar50._0_16_,auVar50._16_16_);
          auVar6 = vpunpcklqdq_avx(auVar1,auVar5);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar5);
          auVar1 = vpaddd_avx(auVar6,auVar1);
          auVar5 = vpunpcklqdq_avx(auVar3,auVar4);
          auVar3 = vpunpckhqdq_avx(auVar3,auVar4);
          auVar3 = vpaddd_avx(auVar3,auVar5);
          auVar1 = vpaddd_avx(auVar1,auVar3);
          *(undefined1 (*) [16])*pauVar23 = auVar1;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar25 = (ulong)(uVar17 + 1);
        } while (uVar17 + 1 != uVar2);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_38);
  }
  piVar12 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}